

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForExtension
          (FileGenerator *this,int idx,Printer *printer)

{
  Options *in_RCX;
  NamespaceOpener ns;
  Formatter format;
  string local_98;
  NamespaceOpener local_78;
  Formatter local_58;
  
  local_58.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_58.vars_._M_t,&(this->variables_)._M_t);
  GenerateSourceIncludes(this,printer);
  Namespace_abi_cxx11_(&local_98,(cpp *)this->file_,(FileDescriptor *)&this->options_,in_RCX);
  NamespaceOpener::NamespaceOpener(&local_78,&local_98,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  ExtensionGenerator::GenerateDefinition
            ((ExtensionGenerator *)
             (this->extension_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[idx]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
             ._M_t,printer);
  NamespaceOpener::~NamespaceOpener(&local_78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_58.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateSourceForExtension(int idx, io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);
  NamespaceOpener ns(Namespace(file_, options_), format);
  extension_generators_[idx]->GenerateDefinition(printer);
}